

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O3

void Unserialize<DataStream,uint256,std::less<uint256>,std::allocator<uint256>>
               (DataStream *is,set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *m)

{
  uint64_t uVar1;
  iterator __position;
  _Alloc_node *in_RCX;
  uint uVar2;
  long in_FS_OFFSET;
  uint256 key;
  _Alloc_node local_60;
  uint256 local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
  ::clear(&m->_M_t);
  uVar1 = ReadCompactSize<DataStream>(is,true);
  if ((int)uVar1 != 0) {
    __position._M_node = (m->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_58.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      local_58.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      local_58.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      local_58.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      local_58.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      local_58.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      local_58.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      local_58.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      local_58.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      local_58.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      local_58.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      local_58.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      local_58.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      local_58.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      local_58.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      local_58.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      local_58.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      local_58.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      local_58.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      local_58.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      local_58.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      local_58.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      local_58.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      local_58.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      local_58.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      local_58.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      local_58.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      local_58.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      local_58.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      local_58.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      local_58.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      local_58.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      DataStream::read(is,(int)&local_58,(void *)0x20,(size_t)in_RCX);
      in_RCX = &local_60;
      local_60._M_t = &m->_M_t;
      __position = std::
                   _Rb_tree<uint256,uint256,std::_Identity<uint256>,std::less<uint256>,std::allocator<uint256>>
                   ::
                   _M_insert_unique_<uint256_const&,std::_Rb_tree<uint256,uint256,std::_Identity<uint256>,std::less<uint256>,std::allocator<uint256>>::_Alloc_node>
                             ((_Rb_tree<uint256,uint256,std::_Identity<uint256>,std::less<uint256>,std::allocator<uint256>>
                               *)m,__position._M_node,&local_58,&local_60);
      uVar2 = (int)uVar1 - 1;
      uVar1 = (uint64_t)uVar2;
    } while (uVar2 != 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& is, std::set<K, Pred, A>& m)
{
    m.clear();
    unsigned int nSize = ReadCompactSize(is);
    typename std::set<K, Pred, A>::iterator it = m.begin();
    for (unsigned int i = 0; i < nSize; i++)
    {
        K key;
        Unserialize(is, key);
        it = m.insert(it, key);
    }
}